

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_resumption_impl(int different_preferred_key_share,int require_client_authentication)

{
  ptls_key_exchange_algorithm_t **pppVar1;
  ptls_iovec_t pVar2;
  ptls_iovec_t ticket;
  ptls_iovec_t ticket_00;
  ptls_iovec_t ticket_01;
  ptls_iovec_t ticket_02;
  uint8_t *local_50;
  size_t local_48;
  ptls_save_ticket_t local_40;
  ptls_save_ticket_t st;
  ptls_encrypt_ticket_t et;
  ptls_key_exchange_algorithm_t **key_exchanges_orig;
  ptls_key_exchange_algorithm_t *different_key_exchanges [3];
  int require_client_authentication_local;
  int different_preferred_key_share_local;
  
  different_key_exchanges[2]._0_4_ = require_client_authentication;
  different_key_exchanges[2]._4_4_ = different_preferred_key_share;
  if ((*ctx->key_exchanges)->id != (*ctx_peer->key_exchanges)->id) {
    __assert_fail("ctx->key_exchanges[0]->id == ctx_peer->key_exchanges[0]->id",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                  ,0x38d,"void test_resumption_impl(int, int)");
  }
  if (ctx->key_exchanges[1] != (ptls_key_exchange_algorithm_t *)0x0) {
    __assert_fail("ctx->key_exchanges[1] == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                  ,0x38e,"void test_resumption_impl(int, int)");
  }
  if (ctx_peer->key_exchanges[1] != (ptls_key_exchange_algorithm_t *)0x0) {
    __assert_fail("ctx_peer->key_exchanges[1] == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                  ,0x38f,"void test_resumption_impl(int, int)");
  }
  if ((*ctx->key_exchanges)->id != 0x1d) {
    key_exchanges_orig = (ptls_key_exchange_algorithm_t **)&ptls_minicrypto_x25519;
    different_key_exchanges[0] = *ctx->key_exchanges;
    different_key_exchanges[1] = (ptls_key_exchange_algorithm_t *)0x0;
    pppVar1 = ctx->key_exchanges;
    if (different_preferred_key_share != 0) {
      ctx->key_exchanges = (ptls_key_exchange_algorithm_t **)&key_exchanges_orig;
    }
    st.cb = on_copy_ticket;
    local_40.cb = on_save_ticket;
    if (ctx_peer->ticket_lifetime != 0) {
      __assert_fail("ctx_peer->ticket_lifetime == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                    ,0x39a,"void test_resumption_impl(int, int)");
    }
    if (ctx_peer->max_early_data_size != 0) {
      __assert_fail("ctx_peer->max_early_data_size == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                    ,0x39b,"void test_resumption_impl(int, int)");
    }
    if (ctx_peer->encrypt_ticket == (ptls_encrypt_ticket_t *)0x0) {
      if (ctx_peer->save_ticket == (ptls_save_ticket_t *)0x0) {
        pVar2 = ptls_iovec_init((void *)0x0,0);
        local_50 = pVar2.base;
        saved_ticket.base = local_50;
        local_48 = pVar2.len;
        saved_ticket.len = local_48;
        ctx_peer->ticket_lifetime = 0x15180;
        ctx_peer->max_early_data_size = 0x2000;
        ctx_peer->encrypt_ticket = (ptls_encrypt_ticket_t *)&st;
        ctx->save_ticket = &local_40;
        sc_callcnt = 0;
        pVar2.len = saved_ticket.len;
        pVar2.base = saved_ticket.base;
        test_handshake(pVar2,(uint)(different_key_exchanges[2]._4_4_ != 0),1,0,0);
        _ok((uint)(sc_callcnt == 1),"%s %d",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
            0x3a7);
        _ok((uint)(saved_ticket.base != (uint8_t *)0x0),"%s %d",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
            0x3a8);
        ticket.len = saved_ticket.len;
        ticket.base = saved_ticket.base;
        test_handshake(ticket,0,1,0,(int)different_key_exchanges[2]);
        if ((int)different_key_exchanges[2] == 1) {
          _ok((uint)(sc_callcnt == 3),"%s %d",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
              ,0x3ad);
        }
        else {
          _ok((uint)(sc_callcnt == 1),"%s %d",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
              ,0x3af);
        }
        ticket_00.len = saved_ticket.len;
        ticket_00.base = saved_ticket.base;
        test_handshake(ticket_00,4,1,0,(int)different_key_exchanges[2]);
        if ((int)different_key_exchanges[2] == 1) {
          _ok((uint)(sc_callcnt == 5),"%s %d",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
              ,0x3b5);
        }
        else {
          _ok((uint)(sc_callcnt == 1),"%s %d",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
              ,0x3b7);
        }
        ctx->field_0x70 = ctx->field_0x70 & 0xfe | 1;
        ticket_01.len = saved_ticket.len;
        ticket_01.base = saved_ticket.base;
        test_handshake(ticket_01,0,1,0,(int)different_key_exchanges[2]);
        if ((int)different_key_exchanges[2] == 1) {
          _ok((uint)(sc_callcnt == 7),"%s %d",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
              ,0x3bf);
        }
        else {
          _ok((uint)(sc_callcnt == 1),"%s %d",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
              ,0x3c1);
        }
        ticket_02.len = saved_ticket.len;
        ticket_02.base = saved_ticket.base;
        test_handshake(ticket_02,4,1,0,(int)different_key_exchanges[2]);
        if ((int)different_key_exchanges[2] == 1) {
          _ok((uint)(sc_callcnt == 9),"%s %d",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
              ,0x3c7);
        }
        else {
          _ok((uint)(sc_callcnt == 1),"%s %d",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
              ,0x3c9);
        }
        ctx->field_0x70 = ctx->field_0x70 & 0xfe;
        ctx_peer->ticket_lifetime = 0;
        ctx_peer->max_early_data_size = 0;
        ctx_peer->encrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
        ctx->save_ticket = (ptls_save_ticket_t *)0x0;
        ctx->key_exchanges = pppVar1;
        return;
      }
      __assert_fail("ctx_peer->save_ticket == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                    ,0x39d,"void test_resumption_impl(int, int)");
    }
    __assert_fail("ctx_peer->encrypt_ticket == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                  ,0x39c,"void test_resumption_impl(int, int)");
  }
  __assert_fail("ctx->key_exchanges[0]->id != ptls_minicrypto_x25519.id",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                ,0x390,"void test_resumption_impl(int, int)");
}

Assistant:

static void test_resumption_impl(int different_preferred_key_share, int require_client_authentication)
{
    assert(ctx->key_exchanges[0]->id == ctx_peer->key_exchanges[0]->id);
    assert(ctx->key_exchanges[1] == NULL);
    assert(ctx_peer->key_exchanges[1] == NULL);
    assert(ctx->key_exchanges[0]->id != ptls_minicrypto_x25519.id);
    ptls_key_exchange_algorithm_t *different_key_exchanges[] = {&ptls_minicrypto_x25519, ctx->key_exchanges[0], NULL},
                                  **key_exchanges_orig = ctx->key_exchanges;

    if (different_preferred_key_share)
        ctx->key_exchanges = different_key_exchanges;

    ptls_encrypt_ticket_t et = {on_copy_ticket};
    ptls_save_ticket_t st = {on_save_ticket};

    assert(ctx_peer->ticket_lifetime == 0);
    assert(ctx_peer->max_early_data_size == 0);
    assert(ctx_peer->encrypt_ticket == NULL);
    assert(ctx_peer->save_ticket == NULL);
    saved_ticket = ptls_iovec_init(NULL, 0);

    ctx_peer->ticket_lifetime = 86400;
    ctx_peer->max_early_data_size = 8192;
    ctx_peer->encrypt_ticket = &et;
    ctx->save_ticket = &st;

    sc_callcnt = 0;
    test_handshake(saved_ticket, different_preferred_key_share ? TEST_HANDSHAKE_2RTT : TEST_HANDSHAKE_1RTT, 1, 0, 0);
    ok(sc_callcnt == 1);
    ok(saved_ticket.base != NULL);

    /* psk using saved ticket */
    test_handshake(saved_ticket, TEST_HANDSHAKE_1RTT, 1, 0, require_client_authentication);
    if (require_client_authentication == 1) {
        ok(sc_callcnt == 3);
    } else {
        ok(sc_callcnt == 1);
    }

    /* 0-rtt psk using saved ticket */
    test_handshake(saved_ticket, TEST_HANDSHAKE_EARLY_DATA, 1, 0, require_client_authentication);
    if (require_client_authentication == 1) {
        ok(sc_callcnt == 5);
    } else {
        ok(sc_callcnt == 1);
    }

    ctx->require_dhe_on_psk = 1;

    /* psk-dhe using saved ticket */
    test_handshake(saved_ticket, TEST_HANDSHAKE_1RTT, 1, 0, require_client_authentication);
    if (require_client_authentication == 1) {
        ok(sc_callcnt == 7);
    } else {
        ok(sc_callcnt == 1);
    }

    /* 0-rtt psk-dhe using saved ticket */
    test_handshake(saved_ticket, TEST_HANDSHAKE_EARLY_DATA, 1, 0, require_client_authentication);
    if (require_client_authentication == 1) {
        ok(sc_callcnt == 9);
    } else {
        ok(sc_callcnt == 1);
    }

    ctx->require_dhe_on_psk = 0;
    ctx_peer->ticket_lifetime = 0;
    ctx_peer->max_early_data_size = 0;
    ctx_peer->encrypt_ticket = NULL;
    ctx->save_ticket = NULL;
    ctx->key_exchanges = key_exchanges_orig;
}